

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Response.cpp
# Opt level: O2

int __thiscall MNS::Response::end(Response *this,char *data,uint dataLen)

{
  uint uVar1;
  char *__dest;
  void *pvVar2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  int iVar5;
  uint uVar6;
  char *__src;
  string strDataLen;
  string msg;
  
  uVar1 = dataLen + 0x200;
  if (this->bufferSize < uVar1) {
    uVar6 = 0x1000;
    if (0x1000 < uVar1) {
      uVar6 = uVar1;
    }
    uVar6 = this->bufferSize + uVar6;
    this->bufferSize = uVar6;
    __dest = (char *)realloc(this->responseBuffer,(ulong)uVar6);
    this->responseBuffer = __dest;
  }
  else {
    __dest = this->responseBuffer;
  }
  __src = "HTTP/1.0 ";
  if (this->socketData->request->httpVersion == HTTP_1_1) {
    __src = "HTTP/1.1 ";
  }
  pvVar2 = mempcpy(__dest,__src,9);
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&Server::response_msgs_abi_cxx11_,&this->statusCode);
  std::__cxx11::string::string((string *)&msg,(string *)pmVar3);
  pvVar2 = mempcpy(pvVar2,msg._M_dataplus._M_p,msg._M_string_length);
  std::__cxx11::to_string(&strDataLen,this->bufferLen + dataLen);
  pvVar2 = mempcpy(pvVar2,"Content-Length",0xe);
  pvVar2 = mempcpy(pvVar2,": ",2);
  pvVar2 = mempcpy(pvVar2,strDataLen._M_dataplus._M_p,
                   CONCAT44(strDataLen._M_string_length._4_4_,(int)strDataLen._M_string_length));
  pvVar2 = mempcpy(pvVar2,"\r\n",2);
  if (this->sendDate == true) {
    pvVar2 = mempcpy(pvVar2,"Date",4);
    pvVar2 = mempcpy(pvVar2,": ",2);
    pvVar2 = mempcpy(pvVar2,Server::currTime_abi_cxx11_._M_dataplus._M_p,
                     CONCAT44(Server::currTime_abi_cxx11_._M_string_length._4_4_,
                              (int)Server::currTime_abi_cxx11_._M_string_length));
    pvVar2 = mempcpy(pvVar2,"\r\n",2);
    iVar5 = (int)strDataLen._M_string_length + (int)msg._M_string_length + 0x23 +
            (int)Server::currTime_abi_cxx11_._M_string_length;
  }
  else {
    iVar5 = (int)strDataLen._M_string_length + 0x1b + (int)msg._M_string_length;
  }
  for (p_Var4 = (this->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->headers)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    pvVar2 = mempcpy(pvVar2,*(void **)(p_Var4 + 1),(size_t)p_Var4[1]._M_parent);
    pvVar2 = mempcpy(pvVar2,": ",2);
    pvVar2 = mempcpy(pvVar2,*(void **)(p_Var4 + 2),(size_t)p_Var4[2]._M_parent);
    pvVar2 = mempcpy(pvVar2,"\r\n",2);
    iVar5 = iVar5 + 4 + *(int *)&p_Var4[2]._M_parent + *(int *)&p_Var4[1]._M_parent;
  }
  pvVar2 = mempcpy(pvVar2,"\r\n",2);
  uVar1 = iVar5 + 2;
  if ((ulong)this->bufferLen != 0) {
    pvVar2 = mempcpy(pvVar2,this->buffer,(ulong)this->bufferLen);
    uVar1 = uVar1 + this->bufferLen;
  }
  if (data != (char *)0x0) {
    mempcpy(pvVar2,data,(ulong)dataLen);
    uVar1 = uVar1 + dataLen;
  }
  this->bufferLen = uVar1;
  iVar5 = uv_is_closing(this->socketData->poll_h);
  if (iVar5 == 0) {
    uv_poll_start(this->socketData->poll_h,2,Server::onWriteData);
  }
  this->finished = true;
  std::__cxx11::string::~string((string *)&strDataLen);
  std::__cxx11::string::~string((string *)&msg);
  return 0;
}

Assistant:

int MNS::Response::end(const char *data, unsigned int dataLen) {
//	int offset = std::sprintf(this->buffer, "HTTP/1.1 200 OK\r\nContent-Length: %u\r\n\r\n", (unsigned int) dataLen);
//	memcpy(this->buffer+offset, data, dataLen);
//
//	this->bufferLen = offset + dataLen;
//
//	uv_poll_start(this->socketData->poll_h, UV_WRITABLE, MNS::Server::onWriteData);
//	return 0;

	if(this->bufferSize < dataLen + 512) {
		int ns = std::max(dataLen + 512, (unsigned int)4096);
		this->bufferSize = this->bufferSize + ns;
		this->responseBuffer = (char *)realloc(this->responseBuffer, this->bufferSize);
	}

	int offset = 0;
	//this->setHeader(std::string("Date", 4), MNS::Server::currTime);
	//this->setHeader(std::string("Content-Length", 14), std::to_string(dataLen));

	MNS::Request *request = this->socketData->request;
	char *rb = this->responseBuffer;
	// First print the status code
	rb = (char *)mempcpy(rb, (request->httpVersion==HTTP_VERSION::HTTP_1_1)?"HTTP/1.1 ":"HTTP/1.0 ", 9);
	// Copy the response MSG
	std::string msg = MNS::Server::response_msgs[this->statusCode];
	rb = (char *)mempcpy(rb, msg.c_str(), msg.length());
	offset += msg.length() + 9;

	// Set the static headers

	// Content-Length
	std::string strDataLen = std::to_string(bufferLen + dataLen);
	rb = (char *)mempcpy(rb, "Content-Length", 14);
	rb = (char *)mempcpy(rb, ": ", 2);
	rb = (char *)mempcpy(rb, strDataLen.c_str(), strDataLen.length());
	rb = (char *)mempcpy(rb, "\r\n", 2);
	offset += strDataLen.length() + 18;

	// Date
	if(this->sendDate) {
		rb = (char *) mempcpy(rb, "Date", 4);
		rb = (char *) mempcpy(rb, ": ", 2);
		rb = (char *) mempcpy(rb, MNS::Server::currTime.c_str(), MNS::Server::currTime.length());
		rb = (char *) mempcpy(rb, "\r\n", 2);
		offset += MNS::Server::currTime.length() + 8;
	}

	// Copy the headers
	for(std::map<std::string, std::string>::const_iterator header = this->headers.begin(); header != this->headers.end(); header++) {
		rb = (char *)mempcpy(rb, header->first.c_str(), header->first.length());
		rb = (char *)mempcpy(rb, ": ", 2);
		rb = (char *)mempcpy(rb, header->second.c_str(), header->second.length());
		rb = (char *)mempcpy(rb, "\r\n", 2);
		offset += header->first.length() + header->second.length() + 4;
	}

	// Copy trailing line end
	rb = (char *)mempcpy(rb, "\r\n", 2);
	offset += 2;

	// Finally copy the buffer
	if(this->bufferLen) {
		rb = (char *)mempcpy(rb, this->buffer, this->bufferLen);
		offset += this->bufferLen;
	}

	// Copy the sent data
	if(data) {
		rb = (char *)mempcpy(rb, data, dataLen);
		offset += dataLen;
	}

	this->bufferLen = offset;

	if(!uv_is_closing((uv_handle_t*)this->socketData->poll_h))
		uv_poll_start(this->socketData->poll_h, UV_WRITABLE, MNS::Server::onWriteData);
	this->finished = true;

	return 0;

	/*
	MNS::Request *request = this->socketData->request;

	if(data) {
		//unsigned int dataLen = strlen(data);
		if(this->bufferSize - bufferLen < dataLen) {
			this->bufferSize = (dataLen>1024)?this->bufferSize + dataLen:this->bufferSize + 1024;
			this->buffer = (char *)realloc(this->buffer, this->bufferSize);
		}

		memcpy(this->buffer + this->bufferLen, data, dataLen);
		this->bufferLen += dataLen;
	}


	this->setHeader(std::string("Content-Length", 14), std::to_string(this->bufferLen));
	this->setHeader("Date", MNS::Server::currTime);

	response.append((request->httpVersion==HTTP_VERSION::HTTP_1_1)?"HTTP/1.1 ":"HTTP/1.0 ", 9);
	response.append(MNS::Server::response_msgs[this->statusCode]);

	for(std::map<std::string, std::string>::const_iterator header = this->headers.begin(); header != this->headers.end(); header++) {
		response.append(header->first);
		response.append(": ", 2);
		response.append(header->second);
		response.append("\r\n", 2);
	}

	response.append("\r\n", 2);
	response.append(this->buffer, this->bufferLen);

//	ssize_t numSent = send(this->socketData->fd, response.c_str(), response.length(), 0);
//	if(numSent == (int)response.length()) {
//		this->bufferLen = 0;
//		response.clear();
//		//uv_poll_start(handle, UV_READABLE, onReadData);
//	}
//	uv_poll_start(this->socketData->poll_h, UV_READABLE, MNS::Server::onReadData);
	uv_poll_start(this->socketData->poll_h, UV_WRITABLE, MNS::Server::onWriteData);
	this->finished = true;

	return 0;*/
}